

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_casetab.cpp
# Opt level: O3

bool parse(char *line,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arr)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  int iVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(arr,(arr->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start);
  if ((line != (char *)0x0) && (pcVar2 = strchr(line,0x3b), pcVar2 != (char *)0x0)) {
    paVar1 = &local_50.field_2;
    iVar3 = 0xe;
    do {
      local_50._M_dataplus._M_p = (pointer)paVar1;
      if (pcVar2 == line) {
        local_50._M_string_length = 0;
        local_50.field_2._M_local_buf[0] = '\0';
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,line,pcVar2);
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)arr,&local_50)
      ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar1) {
        operator_delete(local_50._M_dataplus._M_p,
                        CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                 local_50.field_2._M_local_buf[0]) + 1);
      }
      line = pcVar2 + 1;
      pcVar2 = strchr(line,0x3b);
      iVar3 = iVar3 + -1;
    } while (pcVar2 != (char *)0x0);
    return iVar3 == 0;
  }
  return false;
}

Assistant:

bool parse (const char* line, vector<string>& arr)
{
  int nf = 0;
  arr.clear ();
  while (line)
  {
    const char* pend = strchr (line, ';');
    if (!pend)
      break;
    size_t len = pend - line;
    arr.push_back (len ? string (line, len) : string ());
    line = pend + 1;
    ++nf;
  }
  return (nf == 14);
}